

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall
CMeshClosestPointMapper::TcSeamlessPatch::AddNextStepFi(TcSeamlessPatch *this,int fi)

{
  bool bVar1;
  reference piVar2;
  iterator iStack_30;
  int nextStepFi;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  TcSeamlessPatch *pTStack_10;
  int fi_local;
  TcSeamlessPatch *this_local;
  
  __range2._4_4_ = fi;
  pTStack_10 = this;
  __end2 = std::vector<int,_std::allocator<int>_>::begin(&this->m_nextStepFis);
  iStack_30 = std::vector<int,_std::allocator<int>_>::end(&this->m_nextStepFis);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd0);
    if (!bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->m_nextStepFis,(value_type_conflict3 *)((long)&__range2 + 4));
      return;
    }
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end2);
    if (__range2._4_4_ == *piVar2) break;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2);
  }
  return;
}

Assistant:

void AddNextStepFi(int fi)
    {
      for (int nextStepFi : m_nextStepFis)
      {
        if (fi == nextStepFi)
          return;
      }
      m_nextStepFis.push_back(fi);
    }